

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::CPX_IM(CPU *this)

{
  byte bVar1;
  byte bVar2;
  
  this->cycles = 2;
  bVar1 = GetByte(this);
  bVar2 = this->X - bVar1;
  (this->field_6).ps =
       bVar2 & 0x80 | (bVar2 == 0) * '\x02' | bVar1 <= this->X | (this->field_6).ps & 0x7c;
  return;
}

Assistant:

void CPU::CPX_IM()
{
    cycles = 2;
    uint8_t op = GetByte();
    uint8_t res = X - op;
    C = (X >= op);
    Z = (X == op);
    N = (res & 0b10000000) > 0;
}